

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O0

int Llb_ManReachMinCut(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Aig_Man_t *p_00;
  Vec_Ptr_t *vResult_00;
  long local_48;
  abctime clk;
  int RetValue;
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  clk._4_4_ = -1;
  aVar2 = Abc_Clock();
  if (pPars->TimeLimit == 0) {
    local_48 = 0;
  }
  else {
    iVar1 = pPars->TimeLimit;
    aVar3 = Abc_Clock();
    local_48 = (long)iVar1 * 1000000 + aVar3;
  }
  pPars->TimeTarget = local_48;
  p_00 = Aig_ManDupFlopsOnly(pAig);
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(pAig);
  }
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(p_00);
  }
  Aig_ManFanoutStart(p_00);
  vResult_00 = Llb_ManComputeCuts(p_00,pPars->nPartValue,pPars->fVerbose,pPars->fVeryVerbose);
  if ((pPars->TimeLimit != 0) && (aVar3 = Abc_Clock(), pPars->TimeTarget < aVar3)) {
    if (pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) after partitioning.\n",(ulong)(uint)pPars->TimeLimit);
    }
    Vec_VecFree((Vec_Vec_t *)vResult_00);
    Aig_ManFanoutStop(p_00);
    Aig_ManCleanMarkAB(p_00);
    Aig_ManStop(p_00);
    return -1;
  }
  if (pPars->fSkipReach == 0) {
    clk._4_4_ = Llb_CoreExperiment(pAig,p_00,pPars,vResult_00,pPars->TimeTarget);
  }
  Vec_VecFree((Vec_Vec_t *)vResult_00);
  Aig_ManFanoutStop(p_00);
  Aig_ManCleanMarkAB(p_00);
  Aig_ManStop(p_00);
  if (clk._4_4_ == -1) {
    aVar3 = Abc_Clock();
    Abc_PrintTime(1,"Total runtime of the min-cut-based reachability engine",aVar3 - aVar2);
  }
  return clk._4_4_;
}

Assistant:

int Llb_ManReachMinCut( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    extern Vec_Ptr_t * Llb_ManComputeCuts( Aig_Man_t * p, int Num, int fVerbose, int fVeryVerbose );
    Vec_Ptr_t * vResult;
    Aig_Man_t * p;
    int RetValue = -1;
    abctime clk = Abc_Clock();

    // compute time to stop
    pPars->TimeTarget = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fVerbose )
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, pPars->nPartValue, pPars->fVerbose, pPars->fVeryVerbose );

    if ( pPars->TimeLimit && Abc_Clock() > pPars->TimeTarget )
    {
        if ( !pPars->fSilent )
            printf( "Reached timeout (%d seconds) after partitioning.\n", pPars->TimeLimit );

        Vec_VecFree( (Vec_Vec_t *)vResult );
        Aig_ManFanoutStop( p );
        Aig_ManCleanMarkAB( p );
        Aig_ManStop( p );
        return RetValue;
    }

    if ( !pPars->fSkipReach )
        RetValue = Llb_CoreExperiment( pAig, p, pPars, vResult, pPars->TimeTarget );

    Vec_VecFree( (Vec_Vec_t *)vResult );
    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );

    if ( RetValue == -1 )
        Abc_PrintTime( 1, "Total runtime of the min-cut-based reachability engine", Abc_Clock() - clk );
    return RetValue;
}